

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseTemplateParam(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  short sVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  State copy;
  
  bVar9 = ParseTwoCharToken(state,"T_");
  if (bVar9) {
LAB_001180df:
    MaybeAppend(state,"?");
    bVar9 = true;
  }
  else {
    pcVar1 = state->mangled_cur;
    pcVar2 = state->out_cur;
    pcVar3 = state->out_begin;
    pcVar4 = state->out_end;
    pcVar5 = state->prev_name;
    iVar6 = state->prev_name_length;
    sVar7 = state->nest_level;
    bVar9 = state->append;
    bVar8 = state->overflowed;
    if (*state->mangled_cur == 'T') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar10 = ParseNumber(state,(int *)0x0);
      if ((bVar10) && (*state->mangled_cur == '_')) {
        state->mangled_cur = state->mangled_cur + 1;
        goto LAB_001180df;
      }
    }
    state->prev_name = pcVar5;
    state->prev_name_length = iVar6;
    state->nest_level = sVar7;
    state->append = bVar9;
    state->overflowed = bVar8;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

static bool ParseTemplateParam(State *state) {
  if (ParseTwoCharToken(state, "T_")) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;
  }

  State copy = *state;
  if (ParseOneCharToken(state, 'T') && ParseNumber(state, NULL) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;
  }
  *state = copy;
  return false;
}